

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_set_time(spng_ctx *ctx,spng_time *time)

{
  ulong uVar1;
  int iVar2;
  
  if (time != (spng_time *)0x0 && ctx != (spng_ctx *)0x0) {
    if ((ctx->data == (uchar *)0x0) && ((ctx->field_0xcc & 0x10) == 0)) {
      iVar2 = 0x52;
    }
    else {
      iVar2 = read_chunks(ctx,0);
      if (iVar2 == 0) {
        iVar2 = check_time(time);
        if (iVar2 == 0) {
          ctx->time = *time;
          uVar1._0_4_ = ctx->user;
          uVar1._4_4_ = ctx->stored;
          ctx->user = (spng_chunk_bitfield)(int)(uVar1 | 0x200000002000);
          ctx->stored = (spng_chunk_bitfield)(int)((uVar1 | 0x200000002000) >> 0x20);
          iVar2 = 0;
        }
        else {
          iVar2 = 0x3b;
        }
      }
    }
    return iVar2;
  }
  return 1;
}

Assistant:

int spng_set_time(spng_ctx *ctx, struct spng_time *time)
{
    SPNG_SET_CHUNK_BOILERPLATE(time);

    if(check_time(time)) return SPNG_ETIME;

    ctx->time = *time;

    ctx->stored.time = 1;
    ctx->user.time = 1;

    return 0;
}